

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

treeNode * simpleExp(void)

{
  bool bVar1;
  bool bVar2;
  treeNode *ptVar3;
  treeNode *ptVar4;
  string local_88;
  string local_68;
  string local_48;
  
  ptVar3 = term();
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"+","");
  bVar1 = match(&local_48,Empty);
  bVar2 = true;
  if (!bVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"-","");
    bVar2 = match(&local_68,Empty);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar2 != false) {
    ptVar4 = (treeNode *)operator_new(0x58);
    (ptVar4->lineNo).row = 0;
    (ptVar4->lineNo).col = 0;
    ptVar4->nodeKind = statement;
    ptVar4->kind = (Kind)0x0;
    ptVar4->child[0] = (treeNode *)0x0;
    ptVar4->child[1] = (treeNode *)0x0;
    ptVar4->child[2] = (treeNode *)0x0;
    ptVar4->sibling = (treeNode *)0x0;
    (ptVar4->text)._M_dataplus._M_p = (pointer)&(ptVar4->text).field_2;
    (ptVar4->text)._M_string_length = 0;
    (ptVar4->text).field_2._M_local_buf[0] = '\0';
    ptVar4->attrKind = Text;
    ptVar4->nodeKind = expression;
    ptVar4->kind = (Kind)0x3;
    ptVar4->child[0] = ptVar3;
    ptVar3 = (treeNode *)operator_new(0x58);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,preToken.text._M_dataplus._M_p,
               preToken.text._M_dataplus._M_p + preToken.text._M_string_length);
    treeNode::treeNode(ptVar3,opExp,&local_88);
    ptVar4->child[1] = ptVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    ptVar3 = simpleExp();
    ptVar4->child[2] = ptVar3;
    ptVar3 = ptVar4;
  }
  return ptVar3;
}

Assistant:

treeNode* simpleExp()
{
    auto pterm=term();
    if(match("+")||match("-"))
    {
        treeNode* ret=new treeNode(NodeKind::expression);
        ret->child[0]=pterm;
        ret->child[1]=new treeNode(ExpKind::opExp,preToken.text);
        ret->child[2]=simpleExp();
        return ret;
    }
    else
    {
        return pterm;
    }
}